

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O3

RectangleNode * __thiscall
rengine::AllocationPool<rengine::RectangleNode>::allocate
          (AllocationPool<rengine::RectangleNode> *this)

{
  Node **ppNVar1;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  **ppvVar2;
  undefined1 *puVar3;
  uint uVar4;
  RectangleNode *pRVar5;
  uint *puVar6;
  
  uVar4 = this->m_nextFree;
  if (this->m_poolSize <= uVar4) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,
                  "T *rengine::AllocationPool<rengine::RectangleNode>::allocate() [T = rengine::RectangleNode]"
                 );
  }
  pRVar5 = this->m_memory;
  if (pRVar5 == (RectangleNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,
                  "T *rengine::AllocationPool<rengine::RectangleNode>::allocate() [T = rengine::RectangleNode]"
                 );
  }
  puVar6 = this->m_free;
  if (puVar6 == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,
                  "T *rengine::AllocationPool<rengine::RectangleNode>::allocate() [T = rengine::RectangleNode]"
                 );
  }
  if (puVar6[uVar4] < this->m_poolSize) {
    this->m_nextFree = uVar4 + 1;
    uVar4 = puVar6[uVar4];
    ppNVar1 = &pRVar5[uVar4].super_RectangleNodeBase.super_Node.m_child;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    ppvVar2 = &pRVar5[uVar4].super_RectangleNodeBase.super_Node.super_SignalEmitter.m_buckets;
    *ppvVar2 = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                *)0x0;
    ppvVar2[1] = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                  *)0x0;
    pRVar5[uVar4].super_RectangleNodeBase.super_Node.m_prev = (Node *)0x0;
    *(uint *)&pRVar5[uVar4].super_RectangleNodeBase.super_Node.field_0x30 =
         *(uint *)&pRVar5[uVar4].super_RectangleNodeBase.super_Node.field_0x30 & 0xfffff800 | 0x41;
    puVar3 = &pRVar5[uVar4].super_RectangleNodeBase.super_Node.field_0x34;
    *(undefined8 *)puVar3 = 0;
    *(undefined8 *)(puVar3 + 8) = 0;
    pRVar5[uVar4].super_RectangleNodeBase.super_Node.super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Node_00145110;
    puVar3 = &pRVar5[uVar4].super_RectangleNodeBase.field_0x44;
    *(undefined8 *)puVar3 = 0;
    *(undefined8 *)(puVar3 + 8) = 0;
    return pRVar5 + uVar4;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,
                "T *rengine::AllocationPool<rengine::RectangleNode>::allocate() [T = rengine::RectangleNode]"
               );
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }